

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O1

void __thiscall amrex::StateData::copyOld(StateData *this,StateData *state)

{
  MultiFab *src;
  Real RVar1;
  
  src = (state->old_data)._M_t.
        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  MultiFab::Copy((this->old_data)._M_t.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,src,0,0,
                 *(int *)((long)&(src->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 0xcc),
                 ((IntVect *)
                 ((long)&(src->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 0xc0))->vect
                 [0]);
  RVar1 = (state->old_time).stop;
  (this->old_time).start = (state->old_time).start;
  (this->old_time).stop = RVar1;
  return;
}

Assistant:

void
StateData::copyOld (const StateData& state)
{
    const MultiFab& MF = state.oldData();

    int nc = MF.nComp();
    int ng = MF.nGrow();

    BL_ASSERT(nc == (*old_data).nComp());
    BL_ASSERT(ng == (*old_data).nGrow());

    MultiFab::Copy(*old_data, state.oldData(), 0, 0, nc, ng);

    old_time = state.old_time;
}